

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O0

TermList __thiscall
Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::denormalize
          (Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *this,TermList *results)

{
  BottomFirstIterator i_00;
  uint uVar1;
  size_t sVar2;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *pMVar3;
  Monom *monom_00;
  TermList in_RDI;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *monom;
  size_t idx;
  uint i;
  uint flatIdx;
  Elem flatSize;
  anon_class_1_0_00000001 monomToTerm;
  TermList out;
  ConstantType *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  TermList in_stack_ffffffffffffff40;
  IterTraits<Lib::MappingIterator<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::BottomFirstIterator,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_Polynomial_hpp:1360:12),_unsigned_int>_>
  *in_stack_ffffffffffffff50;
  TermList *in_stack_ffffffffffffff68;
  Monom *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  uint uVar4;
  uint uVar5;
  BottomFirstIterator local_68;
  IterTraits<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::BottomFirstIterator>
  local_58;
  Elem local_40;
  undefined1 local_30 [40];
  uint64_t local_8;
  
  sVar2 = Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::size
                    ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *)
                     in_RDI._content);
  if (sVar2 == 0) {
    IntegerConstantType::IntegerConstantType
              ((IntegerConstantType *)in_stack_ffffffffffffff40._content,
               (int)((ulong)local_30 >> 0x20));
    local_8 = (uint64_t)
              AlascaSignature<Kernel::NumTraits<Kernel::IntegerConstantType>_>::numeralTl
                        (in_stack_ffffffffffffff28);
    IntegerConstantType::~IntegerConstantType((IntegerConstantType *)0x91401e);
  }
  else {
    Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::iterFifo
              ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *)0x914053);
    i_00._pointer._4_4_ = in_stack_ffffffffffffff3c;
    i_00._pointer._0_4_ = in_stack_ffffffffffffff38;
    i_00._afterLast =
         (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
         in_stack_ffffffffffffff40._content;
    local_68 = (BottomFirstIterator)
               Lib::
               iterTraits<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>>>::BottomFirstIterator>
                         (i_00);
    Lib::
    IterTraits<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>>>::BottomFirstIterator>
    ::
    map<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>::denormalize(Kernel::TermList*)const::_lambda(Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>>const&)_1_>
              (&local_58,&local_68);
    local_40 = Lib::
               IterTraits<Lib::MappingIterator<Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::BottomFirstIterator,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/Polynomial.hpp:1360:12),_unsigned_int>_>
               ::sum(in_stack_ffffffffffffff50);
    pMVar3 = Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::top
                       ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *)
                        in_RDI._content);
    Lib::
    Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>
    ::operator->(&pMVar3->factors);
    MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>::nFactors
              ((MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x9140c5);
    Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::top
              ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *)
               in_RDI._content);
    local_8 = (uint64_t)
              denormalize::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)
                         CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                         in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    uVar4 = 1;
    while (uVar5 = uVar4,
          uVar1 = nSummands((Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x914120),
          uVar4 < uVar1) {
      sVar2 = Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::size
                        ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *)
                         in_RDI._content);
      monom_00 = (Monom *)((sVar2 - uVar5) - 1);
      pMVar3 = Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::
               operator[]((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *)
                          in_RDI._content,(size_t)monom_00);
      Lib::
      Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>
      ::operator->(&pMVar3->factors);
      MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>::nFactors
                ((MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x914172);
      denormalize::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)CONCAT44(uVar5,in_stack_ffffffffffffff78),monom_00,
                 (TermList *)pMVar3);
      local_8 = (uint64_t)
                NumTraits<Kernel::IntegerConstantType>::add(in_RDI,in_stack_ffffffffffffff40);
      uVar4 = uVar5 + 1;
    }
  }
  return (TermList)local_8;
}

Assistant:

TermList Polynom<Number>::denormalize(TermList* results) const
{
  auto monomToTerm = [](Monom const& monom, TermList* t) -> TermList {
      auto mon = monom.factors->denormalize(t);
      if (monom.factors->nFactors() == 0) {
        return AlascaSignature<Number>::numeralTl(monom.numeral);
      } else if (monom.numeral == 1) {
        return mon;
      } else {
        return Number::linMul(monom.numeral, mon);
      }
  };

  if (_summands.size() == 0) {
    return AlascaSignature<Number>::numeralTl(Numeral(0));
  } else {

    auto flatSize = iterTraits(_summands.iterFifo())
      .map([](Monom const& m) { return m.factors->nFactors(); })
      .sum();

    auto flatIdx =  flatSize - _summands.top().factors->nFactors();
    TermList out = monomToTerm(_summands.top(), &results[flatIdx]);

    for (unsigned i = 1; i < nSummands(); i++) {
      auto idx = _summands.size() - i - 1 ;
      auto& monom = _summands[idx];
      flatIdx -= monom.factors->nFactors();
      out = Number::add(monomToTerm(monom, &results[flatIdx]), out);
    }
    return out;
  }
}